

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O2

bool __thiscall
slang::ast::DiagnosticVisitor::handleDefault<slang::ast::GenerateBlockArraySymbol>
          (DiagnosticVisitor *this,GenerateBlockArraySymbol *symbol)

{
  bool bVar1;
  bool bVar2;
  DeclaredType *this_00;
  
  bVar2 = (ulong)this->errorLimit < *this->numErrors;
  bVar1 = this->hierarchyProblem;
  if (!bVar2 && (bVar1 & 1U) == 0) {
    this_00 = Symbol::getDeclaredType(&symbol->super_Symbol);
    if (this_00 != (DeclaredType *)0x0) {
      DeclaredType::getType(this_00);
      DeclaredType::getInitializer(this_00);
    }
    ASTVisitor<slang::ast::DiagnosticVisitor,_false,_false,_false,_false>::
    visitDefault<slang::ast::GenerateBlockArraySymbol>
              ((ASTVisitor<slang::ast::DiagnosticVisitor,_false,_false,_false,_false> *)this,symbol)
    ;
  }
  return (bool)(~(bVar2 | bVar1) & 1);
}

Assistant:

bool finishedEarly() const { return numErrors > errorLimit || hierarchyProblem; }